

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

void rd_5dim(char **content,size_t *line_no,int *array,int *dim,int *shift)

{
  int post [5];
  int local_18 [6];
  
  local_18[0] = 0;
  local_18[1] = 0;
  local_18[2] = 0;
  local_18[3] = 0;
  local_18[4] = 0;
  rd_5dim_slice(content,line_no,array,int21_dim,int21_shift,local_18);
  return;
}

Assistant:

PRIVATE void
rd_5dim(char    **content,
        size_t  *line_no,
        int     *array,
        int     dim[5],
        int     shift[5])
{
  int post[5] = {
    0, 0, 0, 0, 0
  };

  rd_5dim_slice(content, line_no, array,
                dim,
                shift,
                post);
}